

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O2

UINT8 memory_raw_read_byte(okim6295_state *chip,UINT32 offset)

{
  UINT8 UVar1;
  uint uVar2;
  
  UVar1 = chip->nmk_mode;
  if (UVar1 == '\0') {
    uVar2 = offset | chip->bank_offs;
  }
  else {
    uVar2 = offset & 0xffff;
    if (-1 >= (char)UVar1 && 0x3ff >= offset) {
      uVar2 = offset;
    }
    uVar2 = (uint)chip->nmk_bank[offset >> (-1 < (char)UVar1 || 0x3ff < offset) * '\b' + 8 & 3] <<
            0x10 | uVar2;
  }
  if (uVar2 < chip->ROMSize) {
    return chip->ROM[uVar2];
  }
  return '\0';
}

Assistant:

static UINT8 memory_raw_read_byte(okim6295_state *chip, UINT32 offset)
{
	UINT32 CurOfs;
	
	if (! chip->nmk_mode)
	{
		CurOfs = chip->bank_offs | offset;
	}
	else
	{
		UINT8 BankID;
		
		if (offset < NMK_TABLESIZE && (chip->nmk_mode & 0x80))
		{
			// pages sample table
			BankID = offset >> NMK_BNKTBLBITS;
			CurOfs = offset & NMK_TABLEMASK;	// 0x3FF, not 0xFF
		}
		else
		{
			BankID = offset >> NMK_BANKBITS;
			CurOfs = offset & NMK_BANKMASK;
		}
		CurOfs |= (chip->nmk_bank[BankID & 0x03] << NMK_BANKBITS);
	}
	if (CurOfs < chip->ROMSize)
		return chip->ROM[CurOfs];
	else
		return 0x00;
}